

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter_properties.h
# Opt level: O0

bool __thiscall
BamTools::PropertyFilterValue::check<signed_char>(PropertyFilterValue *this,char *query)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  char *in_RSI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  bool local_1;
  
  bVar2 = Variant::is_type<signed_char>
                    ((Variant *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if (bVar2) {
    bVar2 = Variant::is_type<std::__cxx11::string>
                      ((Variant *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "Cannot compare different types - query is a string!");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      local_1 = false;
    }
    else {
      switch(*(undefined4 *)(in_RDI + 8)) {
      case 2:
        cVar1 = *in_RSI;
        pcVar5 = Variant::get<signed_char>((Variant *)0x217c3f);
        local_1 = cVar1 == *pcVar5;
        break;
      case 3:
        cVar1 = *in_RSI;
        pcVar5 = Variant::get<signed_char>((Variant *)0x217c6f);
        local_1 = *pcVar5 < cVar1;
        break;
      case 4:
        cVar1 = *in_RSI;
        pcVar5 = Variant::get<signed_char>((Variant *)0x217c9f);
        local_1 = *pcVar5 <= cVar1;
        break;
      case 5:
        cVar1 = *in_RSI;
        pcVar5 = Variant::get<signed_char>((Variant *)0x217ccf);
        local_1 = cVar1 < *pcVar5;
        break;
      case 6:
        iVar3 = (int)*in_RSI;
        pcVar5 = Variant::get<signed_char>((Variant *)0x217cfc);
        local_1 = iVar3 <= *pcVar5;
        break;
      case 7:
        iVar3 = (int)*in_RSI;
        pcVar5 = Variant::get<signed_char>((Variant *)0x217d29);
        local_1 = iVar3 != *pcVar5;
        break;
      default:
        bamtools_noop();
        local_1 = false;
      }
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Cannot compare different types!");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool PropertyFilterValue::check(const T& query) const
{

    // ensure filter value & query are same type
    if (!Value.is_type<T>()) {
        std::cerr << "Cannot compare different types!" << std::endl;
        return false;
    }

    // string matching
    if (Value.is_type<std::string>()) {
        std::cerr << "Cannot compare different types - query is a string!" << std::endl;
        return false;
    }

    // numeric matching based on our filter type
    switch (Type) {
        case (PropertyFilterValue::EXACT):
            return (query == Value.get<T>());
        case (PropertyFilterValue::GREATER_THAN):
            return (query > Value.get<T>());
        case (PropertyFilterValue::GREATER_THAN_EQUAL):
            return (query >= Value.get<T>());
        case (PropertyFilterValue::LESS_THAN):
            return (query < Value.get<T>());
        case (PropertyFilterValue::LESS_THAN_EQUAL):
            return (query <= Value.get<T>());
        case (PropertyFilterValue::NOT):
            return (query != Value.get<T>());
        default:
            BAMTOOLS_ASSERT_UNREACHABLE;
    }
    return false;
}